

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O3

long dd_lk(long *prt,long n,double key)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (n == 1) {
    return 0;
  }
  if (n < 6) {
    if (n < 2) {
      return 0;
    }
    dVar5 = key - (double)*prt;
    dVar4 = -dVar5;
    if (-dVar5 <= dVar5) {
      dVar4 = dVar5;
    }
    lVar2 = 1;
    lVar1 = 0;
    do {
      dVar6 = key - (double)prt[lVar2];
      dVar5 = -dVar6;
      if (-dVar6 <= dVar6) {
        dVar5 = dVar6;
      }
      lVar3 = lVar2;
      if (dVar4 <= dVar5) {
        dVar5 = dVar4;
        lVar3 = lVar1;
      }
      lVar1 = lVar3;
      dVar4 = dVar5;
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
  }
  else {
    lVar2 = 0;
    lVar1 = n + -1;
    do {
      lVar3 = (lVar1 + lVar2) / 2;
      if ((double)prt[lVar3] < key) {
        lVar2 = lVar3 + 1;
        lVar3 = lVar1;
      }
      lVar1 = lVar3;
    } while (lVar2 < lVar3);
    dVar5 = key - (double)prt[lVar2];
    dVar4 = -dVar5;
    if (-dVar5 <= dVar5) {
      dVar4 = dVar5;
    }
    lVar1 = lVar2;
    if (0 < lVar2) {
      dVar6 = key - (double)prt[lVar2 + -1];
      dVar5 = -dVar6;
      if (-dVar6 <= dVar6) {
        dVar5 = dVar6;
      }
      if (dVar5 < dVar4) {
        lVar1 = lVar2 + -1;
        dVar4 = dVar5;
      }
    }
    if (lVar2 < n + -1) {
      dVar6 = key - (double)prt[lVar2 + 1];
      dVar5 = -dVar6;
      if (-dVar6 <= dVar6) {
        dVar5 = dVar6;
      }
      if (dVar5 < dVar4) {
        return lVar2 + 1;
      }
    }
  }
  return lVar1;
}

Assistant:

long dd_lk(long *prt, long n, double key)
      {
      long lw, md, hgh;
      double km,kz;
      long h, i;
      long k;
      double u, v;

      if(n==1) return 0 ;
      if(n<=5) {
        k = 0 ;
        km = key-prt[0]; if(km<0.0) km = -km;
        for(i=1;i<n;i++) {
           kz = key-prt[i]; if(kz<0.0) kz = -kz;
           if(kz<km) {
              km = kz ;
              k = i ;
           }
        }
        return k ;
      }
      lw = 0; hgh=n-1;

      if(lw==hgh) {
         return lw;
      }
      do {
         md = (lw+hgh)/2;
         if(key>prt[md]) {
            lw = md+1;
         } else {
            hgh = md;
         }
      } while (lw<hgh);
      kz = prt[lw];
      u = key-prt[lw]; if(u<0.0) u = -u;
      h = lw;
      if(lw>0) {
        v = key-prt[lw-1]; if(v<0.0) v = -v;
        if(v<u) {
          u = v;
          h = lw-1;
        }
      }
      if(lw<n-1) {
        v = key-prt[lw+1]; if(v<0.0) v = -v;
        if(v<u) {
          u = v;
          h = lw+1;
        }
      }
      return h ;
      }